

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlSetUniformMatrix(int locIndex,Matrix mat)

{
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_48 = mat.m0;
  local_44 = mat.m1;
  local_40 = mat.m2;
  local_3c = mat.m3;
  local_38 = mat.m4;
  local_34 = mat.m5;
  local_30 = mat.m6;
  local_2c = mat.m7;
  local_28 = mat.m8;
  local_24 = mat.m9;
  local_20 = mat.m10;
  local_1c = mat.m11;
  local_18 = mat.m12;
  local_14 = mat.m13;
  local_10 = mat.m14;
  local_c = mat.m15;
  (*glad_glUniformMatrix4fv)(locIndex,1,'\0',&local_48);
  return;
}

Assistant:

void rlSetUniformMatrix(int locIndex, Matrix mat)
{
#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    float matfloat[16] = {
        mat.m0, mat.m1, mat.m2, mat.m3,
        mat.m4, mat.m5, mat.m6, mat.m7,
        mat.m8, mat.m9, mat.m10, mat.m11,
        mat.m12, mat.m13, mat.m14, mat.m15
    };
    glUniformMatrix4fv(locIndex, 1, false, matfloat);
#endif
}